

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O1

void Qentem::Test::TestAddition5(QTest *test)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [8];
  SizeT SVar6;
  Value<char> *pVVar7;
  char *pcVar8;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  ValueC value1;
  ValueC value2;
  char *c_str;
  char *c_str2;
  ValueC *arr_storage;
  VString str;
  VArray arr_var;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_d8;
  char local_c8;
  undefined1 local_b8 [8];
  ulong uStack_b0;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_a8;
  char local_98;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_88;
  undefined1 local_78;
  Value<char> *local_70;
  Value<char> *local_68;
  Value<char> *local_60;
  StringT local_58;
  Array<Qentem::Value<char>_> local_48;
  
  local_d8.array_.storage_ = (Value<char> *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = '\0';
  local_98 = 0;
  local_a8.array_.storage_ = (Value<char> *)0x0;
  local_a8._8_8_ = 0;
  local_48.storage_ = (Value<char> *)0x0;
  local_48.index_ = 0;
  local_48.capacity_ = 0;
  local_58.storage_ = (char *)0x0;
  local_58.length_ = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\b';
  QTest::IsTrue(test,true,0xf84);
  if (local_c8 == '\x03') {
LAB_0011a02e:
    Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  }
  else {
    if ((local_c8 != '\x02') || (local_98 != '\x02')) {
      Value<char>::reset((Value<char> *)&local_d8.array_);
      local_c8 = '\x03';
      goto LAB_0011a02e;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
    local_98 = '\0';
  }
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xf88);
  local_88._0_4_ = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xf89);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != True) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xf8a);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"v");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.number_ = (QNumber64)local_b8;
  local_88.array_.index_ = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar1 << 0x40);
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.number_ = (QNumber64)0x4;
  local_78 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(ZEXT816(0x100000000) << 0x40);
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)local_b8);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  if ((SizeT)uStack_b0 == 0) {
    local_88.number_ = (QNumber64)local_b8;
    local_88._8_8_ = local_b8._8_8_;
    _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                 )ZEXT816(0);
    local_78 = 3;
    Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
    Value<char>::~Value((Value<char> *)&local_88.array_);
  }
  else {
    Array<Qentem::Value<char>_>::operator+=
              (&local_a8.array_,(Array<Qentem::Value<char>_> *)local_b8);
  }
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)local_b8);
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )ZEXT816(0);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)local_b8,1);
  if (local_98 == '\x03') {
LAB_0011a347:
    local_88.number_ = (QNumber64)local_b8;
    local_88._8_8_ = uStack_b0;
    _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                 )(ZEXT816(0) << 0x20);
    local_78 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
    Value<char>::~Value((Value<char> *)&local_88.array_);
  }
  else {
    if (local_98 != '\x02') {
      Value<char>::reset((Value<char> *)&local_a8.array_);
      local_98 = '\x03';
      goto LAB_0011a347;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_b8);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)local_b8);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 8;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xf96);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xf97);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != True) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xf98);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar7->type_ == True) {
    bVar11 = true;
  }
  else if (pVVar7->type_ == ValuePtr) {
    bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == True;
  }
  else {
    bVar11 = false;
  }
  QTest::IsTrue(test,bVar11,0xf99);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 9;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfa1);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfa2);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != False) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfa3);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 9;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfa7);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfa8);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != False) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfa9);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar7->type_ == False) {
    bVar11 = true;
  }
  else if (pVVar7->type_ == ValuePtr) {
    bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == False;
  }
  else {
    bVar11 = false;
  }
  QTest::IsTrue(test,bVar11,0xfaa);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 10;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfb1);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfb2);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != Null) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == Null;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfb3);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\n';
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfb7);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfb8);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != Null) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == Null;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfb9);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar7->type_ == Null) {
    bVar11 = true;
  }
  else if (pVVar7->type_ == ValuePtr) {
    bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == Null;
  }
  else {
    bVar11 = false;
  }
  QTest::IsTrue(test,bVar11,0xfba);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  String<char>::String((String<char> *)&local_88.array_,"-ABCDEF0123456789ABCDEF0123456789-");
  pcVar8 = local_58.storage_;
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar8);
  local_58.storage_ = (char *)local_88.array_.storage_;
  local_58.length_ = local_88.array_.index_;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_70 = (Value<char> *)local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_a8.array_,&local_58);
  if (local_c8 == '\x03') {
LAB_0011a929:
    Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  }
  else {
    if ((local_c8 != '\x02') || (local_98 != '\x02')) {
      Value<char>::reset((Value<char> *)&local_d8.array_);
      local_c8 = '\x03';
      goto LAB_0011a929;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
    local_98 = '\0';
  }
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfc3);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfc4);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != String) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfc5);
  lVar10 = 0;
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xfc6);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  do {
    if (pcVar8[lVar10] != "-ABCDEF0123456789ABCDEF0123456789-"[lVar10]) goto LAB_0011aa28;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011aa28:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0xfc7);
  String<char>::String((String<char> *)&local_88.array_,"#0123456789ABCDEF0123456789ABCDEF#");
  pcVar8 = local_58.storage_;
  if ((Value<char> *)local_58.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar8);
  local_58.storage_ = (char *)local_88.array_.storage_;
  local_58.length_ = local_88.array_.index_;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_68 = (Value<char> *)local_58.storage_;
  Value<char>::operator=((Value<char> *)&local_a8.array_,&local_58);
  if (local_c8 != '\x03') {
    if ((local_c8 == '\x02') && (local_98 == '\x02')) {
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
                 (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
      local_98 = '\0';
      goto LAB_0011ab08;
    }
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
LAB_0011ab08:
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfce);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfcf);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != String) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfd0);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar7->type_ == String) {
    bVar11 = true;
  }
  else if (pVVar7->type_ == ValuePtr) {
    bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar11 = false;
  }
  QTest::IsTrue(test,bVar11,0xfd1);
  lVar10 = 0;
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xfd2);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_68,0xfd3);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  do {
    if (pcVar8[lVar10] != "-ABCDEF0123456789ABCDEF0123456789-"[lVar10]) goto LAB_0011ac69;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011ac69:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0xfd4);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  lVar10 = 0;
  do {
    if (pcVar8[lVar10] != "#0123456789ABCDEF0123456789ABCDEF#"[lVar10]) goto LAB_0011acad;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011acad:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0xfd5);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0x100000000;
  Array<Qentem::Value<char>_>::allocate(&local_88.array_);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_88.array_);
  local_98 = '\x03';
  Array<Qentem::Value<char>_>::~Array(&local_88.array_);
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xfdb);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfdc);
  paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar9 = &local_d8;
  }
  QTest::IsNotNull(test,paVar9,0xfdd);
  paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0;
  if (local_98 == '\x03') {
    paVar9 = &local_a8;
  }
  QTest::IsNotNull(test,paVar9,0xfde);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0x100000000;
  Array<Qentem::Value<char>_>::allocate(&local_88.array_);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_88.array_);
  local_98 = '\x03';
  Array<Qentem::Value<char>_>::~Array(&local_88.array_);
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar12 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xfe2);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff4c;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar4 << 0x20);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfe3);
  paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar9 = &local_d8;
  }
  QTest::IsNotNull(test,paVar9,0xfe4);
  paVar9 = &local_a8;
  if (local_98 != '\x03') {
    paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0;
  }
  QTest::IsNull(test,paVar9,0xfe5);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"-ABCDEF0123456789ABCDEF0123456789-");
  local_88.number_ = (QNumber64)local_b8;
  local_88.array_.index_ = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar2 << 0x40);
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  local_60 = local_48.storage_;
  local_70 = (Value<char> *)Value<char>::StringStorage(local_48.storage_ + 2);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_48);
  local_98 = 3;
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar11 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xff2);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xff3);
  paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar9 = &local_d8;
  }
  QTest::IsNotNull(test,paVar9,0xff4);
  QTest::IsNotNull(test,(void *)local_d8.number_,0xff5);
  local_88.value_ = local_d8.value_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_88.value_,&local_60,0xff6);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar7->type_ != False) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xff7);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  bVar12 = true;
  bVar11 = true;
  if (pVVar7->type_ != True) {
    if (pVVar7->type_ == ValuePtr) {
      bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0xff8);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  if (pVVar7->type_ != String) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0xff9);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xffa);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  lVar10 = 0;
  do {
    if (pcVar8[lVar10] != "-ABCDEF0123456789ABCDEF0123456789-"[lVar10]) goto LAB_0011b16a;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011b16a:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0xffb);
  Array<Qentem::Value<char>_>::Reset(&local_48);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_88.number_ = (QNumber64)0xe;
  local_78 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"#0123456789ABCDEF0123456789ABCDEF#");
  local_88.number_ = (QNumber64)local_b8;
  local_88.array_.index_ = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar3 << 0x40);
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_48,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  local_60 = local_48.storage_;
  local_68 = (Value<char> *)Value<char>::StringStorage(local_48.storage_ + 2);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_48);
  local_98 = '\x03';
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar12 = true;
  bVar11 = true;
  if (local_98 != '\0') {
    if (local_98 == '\x01') {
      bVar11 = (local_a8.array_.storage_)->type_ == Undefined;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0x1006);
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar12 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0x1007);
  SVar6 = Value<char>::Size((Value<char> *)&local_d8.array_);
  local_88._0_4_ = SVar6;
  local_b8._0_4_ = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0x1008);
  paVar9 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar9 = &local_d8;
  }
  QTest::IsNotNull(test,paVar9,0x1009);
  QTest::IsNotNull(test,(void *)local_d8.number_,0x100a);
  local_88.value_ = local_d8.value_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_88.value_,&local_60,0x100b);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar12 = true;
  bVar11 = true;
  if (pVVar7->type_ != False) {
    if (pVVar7->type_ == ValuePtr) {
      bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0x100c);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar7->type_ != True) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0x100d);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  if (pVVar7->type_ == String) {
    bVar11 = true;
  }
  else if (pVVar7->type_ == ValuePtr) {
    bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar11 = false;
  }
  QTest::IsTrue(test,bVar11,0x100e);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0x100f);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  lVar10 = 0;
  do {
    if (pcVar8[lVar10] != "-ABCDEF0123456789ABCDEF0123456789-"[lVar10]) goto LAB_0011b479;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011b479:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0x1010);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,3);
  bVar12 = true;
  bVar11 = true;
  if (pVVar7->type_ != Null) {
    if (pVVar7->type_ == ValuePtr) {
      bVar11 = ((pVVar7->field_0).array_.storage_)->type_ == Null;
    }
    else {
      bVar11 = false;
    }
  }
  QTest::IsTrue(test,bVar11,0x1011);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,4);
  bVar11 = Value<char>::IsNumber(pVVar7);
  QTest::IsTrue(test,bVar11,0x1012);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,4);
  local_88.number_ = (QNumber64)Value<char>::GetDouble(pVVar7);
  local_b8 = (undefined1  [8])0x402c000000000000;
  QTest::IsEqual<double,double>(test,(double *)&local_88.number_,(double *)local_b8,0x1013);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
  if (pVVar7->type_ != String) {
    if (pVVar7->type_ == ValuePtr) {
      bVar12 = ((pVVar7->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar12 = false;
    }
  }
  QTest::IsTrue(test,bVar12,0x1014);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
  local_88.string_.storage_ = Value<char>::StringStorage(pVVar7);
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_68,0x1015);
  pVVar7 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
  pcVar8 = Value<char>::StringStorage(pVVar7);
  lVar10 = 0;
  do {
    if (pcVar8[lVar10] != "#0123456789ABCDEF0123456789ABCDEF#"[lVar10]) goto LAB_0011b5cd;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x22);
  lVar10 = 0x22;
LAB_0011b5cd:
  QTest::IsTrue(test,(int)lVar10 == 0x22,0x1016);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  pcVar8 = local_58.storage_;
  local_c8 = 0;
  if ((Value<char> *)local_58.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(pcVar8);
  Array<Qentem::Value<char>_>::~Array(&local_48);
  Value<char>::~Value((Value<char> *)&local_a8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  return;
}

Assistant:

static void TestAddition5(QTest &test) {
    ValueC        value1;
    ValueC        value2;
    VArray        arr_var;
    const ValueC *arr_storage;
    VString       str;

    /////////////////

    value2 = true;
    test.IsTrue(value2.IsTrue(), __LINE__);

    value1 += Memory::Move(value2);

    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);

    value2 += true;
    value2 += false;
    value2 += nullptr;
    value2 += "v";
    value2 += 4;
    value2 += VArray(1);
    value2 += VHArray(1);

    value2 = true;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = false;

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);

    value2 = false;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsFalse(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);
    test.IsTrue(value1[1].IsNull(), __LINE__);

    value1.Reset();
    /////////////////
    str               = VString("-ABCDEF0123456789ABCDEF0123456789-");
    const char *c_str = str.First();
    value2            = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    str                = VString("#0123456789ABCDEF0123456789ABCDEF#");
    const char *c_str2 = str.First();
    value2             = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsTrue(value1[1].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsEqual(value1[1].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[1].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    /////////////////

    value2 = VArray(1);
    value1.Merge(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value2.GetArray(), __LINE__);

    value2 = VArray(1);
    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value2.GetArray(), __LINE__);

    value1.Reset();
    ///

    arr_var += ValueC{ValueType::False};
    arr_var += ValueC{ValueType::True};
    arr_var += ValueC{VString("-ABCDEF0123456789ABCDEF0123456789-")};
    arr_storage = arr_var.First();
    c_str       = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 3U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    arr_var.Reset();
    arr_var += ValueC{ValueType::Null};
    arr_var += ValueC{14};
    arr_var += ValueC{VString("#0123456789ABCDEF0123456789ABCDEF#")};
    arr_storage = arr_var.First();
    c_str2      = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value2.IsUndefined(), __LINE__);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 6U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(value1[3].IsNull(), __LINE__);
    test.IsTrue(value1[4].IsNumber(), __LINE__);
    test.IsEqual(value1[4].GetNumber(), 14.0, __LINE__);
    test.IsTrue(value1[5].IsString(), __LINE__);
    test.IsEqual(value1[5].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[5].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    //////////////////////////////////////////
}